

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lc.cpp
# Opt level: O0

bool __thiscall libDAI::LC::initProps(LC *this)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  unsigned_long uVar4;
  long in_RDI;
  double dVar5;
  InferenceAlgorithm *in_stack_fffffffffffffba8;
  Properties *pPVar6;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  InferenceAlgorithm *in_stack_fffffffffffffbb8;
  InferenceAlgorithm *this_00;
  allocator<char> *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_339 [88];
  undefined1 local_2e1 [40];
  allocator<char> local_2b9;
  string local_2b8 [32];
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [39];
  undefined1 local_221 [40];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [32];
  value local_110;
  allocator<char> local_109;
  string local_108 [32];
  value local_e8;
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [47];
  bool local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,
             (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
             in_stack_fffffffffffffbe0);
  bVar1 = InferenceAlgorithm::HasProperty
                    ((InferenceAlgorithm *)
                     CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                     (PropertyKey *)in_stack_fffffffffffffba8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf0,
               (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               in_stack_fffffffffffffbe0);
    bVar1 = InferenceAlgorithm::HasProperty
                      ((InferenceAlgorithm *)
                       CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                       (PropertyKey *)in_stack_fffffffffffffba8);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbf0,
                 (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                 in_stack_fffffffffffffbe0);
      bVar1 = InferenceAlgorithm::HasProperty
                        ((InferenceAlgorithm *)
                         CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                         (PropertyKey *)in_stack_fffffffffffffba8);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator(&local_91);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffbf0,
                   (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                   in_stack_fffffffffffffbe0);
        bVar1 = InferenceAlgorithm::HasProperty
                          ((InferenceAlgorithm *)
                           CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                           (PropertyKey *)in_stack_fffffffffffffba8);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator(&local_b9);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffbf0,
                     (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                     in_stack_fffffffffffffbe0);
          bVar1 = InferenceAlgorithm::HasProperty
                            ((InferenceAlgorithm *)
                             CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                             (PropertyKey *)in_stack_fffffffffffffba8);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator(&local_e1);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffbf0,
                       (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                       in_stack_fffffffffffffbe0);
            local_e8 = (value)InferenceAlgorithm::FromStringTo<libDAI::LC::UpdateType>
                                        (in_stack_fffffffffffffba8,(PropertyKey *)0xb7707d);
            *(value *)(in_RDI + 0x118) = local_e8;
            std::__cxx11::string::~string(local_108);
            std::allocator<char>::~allocator(&local_109);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffbf0,
                       (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                       in_stack_fffffffffffffbe0);
            local_110 = (value)InferenceAlgorithm::FromStringTo<libDAI::LC::CavityType>
                                         (in_stack_fffffffffffffba8,(PropertyKey *)0xb7710b);
            *(value *)(in_RDI + 0x11c) = local_110;
            std::__cxx11::string::~string(local_130);
            std::allocator<char>::~allocator(&local_131);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffbf0,
                       (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                       in_stack_fffffffffffffbe0);
            bVar1 = InferenceAlgorithm::HasProperty
                              ((InferenceAlgorithm *)
                               CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                               (PropertyKey *)in_stack_fffffffffffffba8);
            std::__cxx11::string::~string(local_158);
            std::allocator<char>::~allocator(&local_159);
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffbf0,
                         (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                         in_stack_fffffffffffffbe0);
              bVar1 = InferenceAlgorithm::FromStringTo<bool>
                                ((InferenceAlgorithm *)
                                 CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                                 (PropertyKey *)in_stack_fffffffffffffba8);
              *(bool *)(in_RDI + 0x120) = bVar1;
              std::__cxx11::string::~string(local_180);
              std::allocator<char>::~allocator(&local_181);
            }
            else {
              *(undefined1 *)(in_RDI + 0x120) = 1;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffbf0,
                       (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                       in_stack_fffffffffffffbe0);
            dVar5 = InferenceAlgorithm::FromStringTo<double>
                              ((InferenceAlgorithm *)
                               CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                               (PropertyKey *)in_stack_fffffffffffffba8);
            *(double *)(in_RDI + 0x128) = dVar5;
            std::__cxx11::string::~string(local_1a8);
            std::allocator<char>::~allocator(&local_1a9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffbf0,
                       (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                       in_stack_fffffffffffffbe0);
            uVar4 = InferenceAlgorithm::FromStringTo<unsigned_long>
                              ((InferenceAlgorithm *)
                               CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                               (PropertyKey *)in_stack_fffffffffffffba8);
            *(unsigned_long *)(in_RDI + 0x130) = uVar4;
            std::__cxx11::string::~string(local_1d0);
            std::allocator<char>::~allocator(&local_1d1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffbf0,
                       (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                       in_stack_fffffffffffffbe0);
            uVar4 = InferenceAlgorithm::FromStringTo<unsigned_long>
                              ((InferenceAlgorithm *)
                               CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                               (PropertyKey *)in_stack_fffffffffffffba8);
            *(unsigned_long *)(in_RDI + 0x138) = uVar4;
            std::__cxx11::string::~string(local_1f8);
            std::allocator<char>::~allocator(&local_1f9);
            this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_221
            ;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_01,(char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8)
                       ,in_stack_fffffffffffffbe0);
            bVar2 = InferenceAlgorithm::HasProperty
                              ((InferenceAlgorithm *)
                               CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                               (PropertyKey *)in_stack_fffffffffffffba8);
            std::__cxx11::string::~string((string *)(local_221 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_221);
            if ((bVar2 & 1) == 0) {
              *(undefined8 *)(in_RDI + 0x140) = 0;
            }
            else {
              in_stack_fffffffffffffbe0 = &local_249;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffbe8),
                         in_stack_fffffffffffffbe0);
              dVar5 = InferenceAlgorithm::FromStringTo<double>
                                ((InferenceAlgorithm *)
                                 CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                                 (PropertyKey *)in_stack_fffffffffffffba8);
              *(double *)(in_RDI + 0x140) = dVar5;
              std::__cxx11::string::~string(local_248);
              std::allocator<char>::~allocator(&local_249);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffbe8),
                       in_stack_fffffffffffffbe0);
            bVar1 = InferenceAlgorithm::HasProperty
                              ((InferenceAlgorithm *)
                               CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                               (PropertyKey *)in_stack_fffffffffffffba8);
            std::__cxx11::string::~string(local_270);
            std::allocator<char>::~allocator(&local_271);
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffbe8),
                         in_stack_fffffffffffffbe0);
              InferenceAlgorithm::GetPropertyAs<std::__cxx11::string>
                        (in_stack_fffffffffffffbb8,
                         (PropertyKey *)
                         CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
              std::__cxx11::string::operator=((string *)(in_RDI + 0x148),local_298);
              std::__cxx11::string::~string(local_298);
              std::__cxx11::string::~string(local_2b8);
              std::allocator<char>::~allocator(&local_2b9);
            }
            this_00 = (InferenceAlgorithm *)local_2e1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffbe8),
                       in_stack_fffffffffffffbe0);
            bVar3 = InferenceAlgorithm::HasProperty
                              ((InferenceAlgorithm *)
                               CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                               (PropertyKey *)in_stack_fffffffffffffba8);
            std::__cxx11::string::~string((string *)(local_2e1 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_2e1);
            if ((bVar3 & 1) != 0) {
              pPVar6 = (Properties *)local_339;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffbe8),
                         in_stack_fffffffffffffbe0);
              InferenceAlgorithm::FromStringTo<libDAI::Properties>
                        (this_00,(PropertyKey *)CONCAT17(bVar3,in_stack_fffffffffffffbb0));
              Properties::operator=((Properties *)CONCAT17(bVar3,in_stack_fffffffffffffbb0),pPVar6);
              Properties::~Properties((Properties *)0xb779dd);
              std::__cxx11::string::~string((string *)(local_339 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_339);
            }
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool LC::initProps() {
        if( !HasProperty("updates") )
            return false;
        if( !HasProperty("cavity") )
            return false;
        if( !HasProperty("tol") )
            return false;
        if( !HasProperty("maxiter") )
            return false;
        if( !HasProperty("verbose") )
            return false;
        
        Props.updates = FromStringTo<UpdateType>("updates");
        Props.cavity  = FromStringTo<CavityType>("cavity");
        if( HasProperty("reinit") )
            Props.reinit = FromStringTo<bool>("reinit");
        else
            Props.reinit = true;
        Props.tol     = FromStringTo<double>("tol");
        Props.maxiter = FromStringTo<size_t>("maxiter");
        Props.verbose = FromStringTo<size_t>("verbose");
        if( HasProperty("damping") )
            Props.damping = FromStringTo<double>("damping");
        else
            Props.damping = 0.0;
        if (HasProperty("cavainame") )
            Props.cavainame = GetPropertyAs<string>("cavainame");
        if (HasProperty("cavaiopts") )
            Props.cavaiopts = FromStringTo<Properties>("cavaiopts");

        return true;
    }